

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest::SetUp(BasicAuthIntegrationTest *this)

{
  pointer this_00;
  allocator local_69;
  string local_68;
  anon_class_8_1_8991fb9c local_48;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  undefined1 local_20 [24];
  BasicAuthIntegrationTest *this_local;
  
  local_20._16_8_ = this;
  IntegrationTest::SetUp(&this->super_IntegrationTest);
  IntegrationTest::RegisterSomeCounter
            ((IntegrationTest *)local_20,(string *)this,&this->counter_name_);
  std::shared_ptr<prometheus::Registry>::operator=
            (&this->registry_,(shared_ptr<prometheus::Registry> *)local_20);
  std::shared_ptr<prometheus::Registry>::~shared_ptr((shared_ptr<prometheus::Registry> *)local_20);
  this_00 = std::unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>::
            operator->(&(this->super_IntegrationTest).exposer_);
  local_48.this = this;
  std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<prometheus::(anonymous_namespace)::BasicAuthIntegrationTest::SetUp()::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_,void>
            ((function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_40,
             &local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"Some Auth Realm",&local_69);
  Exposer::RegisterAuth
            (this_00,&local_40,&local_68,&(this->super_IntegrationTest).default_metrics_path_);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_40);
  return;
}

Assistant:

void SetUp() override {
    IntegrationTest::SetUp();

    registry_ = RegisterSomeCounter(counter_name_, default_metrics_path_);

    exposer_->RegisterAuth(
        [&](const std::string& user, const std::string& password) {
          return user == username_ && password == password_;
        },
        "Some Auth Realm", default_metrics_path_);
  }